

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcdata_op.cc
# Opt level: O2

void __thiscall Funcdata::truncatedFlow(Funcdata *this,Funcdata *fd,FlowInfo *flow)

{
  PcodeOpBank *o;
  list<PcodeOp_*,_std::allocator<PcodeOp_*>_> *plVar1;
  pointer ppFVar2;
  FuncCallSpecs *this_00;
  Varnode *vn;
  int iVar3;
  PcodeOp *pPVar4;
  undefined4 extraout_var;
  Varnode *vn_00;
  Architecture *this_01;
  LowlevelError *pLVar5;
  ulong uVar6;
  void *__child_stack;
  void *in_R8;
  _List_node_base *p_Var7;
  int4 i;
  ulong uVar8;
  pointer ppJVar9;
  allocator local_1d1;
  VarnodeBank *local_1d0;
  vector<FuncCallSpecs_*,_std::allocator<FuncCallSpecs_*>_> *local_1c8;
  FlowInfo *local_1c0;
  FlowInfo partialflow;
  
  local_1c0 = flow;
  if ((this->obank).optree._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    pLVar5 = (LowlevelError *)__cxa_allocate_exception(0x20);
    std::__cxx11::string::string
              ((string *)&partialflow,"Trying to do truncated flow on pre-existing pcode",&local_1d1
              );
    LowlevelError::LowlevelError(pLVar5,(string *)&partialflow);
    __cxa_throw(pLVar5,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
  }
  o = &this->obank;
  plVar1 = &(fd->obank).deadlist;
  p_Var7 = (_List_node_base *)plVar1;
  while (p_Var7 = (((_List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_> *)&p_Var7->_M_next)->_M_impl)
                  ._M_node.super__List_node_base._M_next, p_Var7 != (_List_node_base *)plVar1) {
    cloneOp(this,(PcodeOp *)p_Var7[1]._M_next,&((PcodeOp *)p_Var7[1]._M_next)->start);
  }
  (this->obank).uniqid = (fd->obank).uniqid;
  local_1d0 = &this->vbank;
  local_1c8 = &this->qlst;
  uVar8 = 0;
  while( true ) {
    ppFVar2 = (fd->qlst).super__Vector_base<FuncCallSpecs_*,_std::allocator<FuncCallSpecs_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar6 = (long)(fd->qlst).super__Vector_base<FuncCallSpecs_*,_std::allocator<FuncCallSpecs_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)ppFVar2 >> 3;
    if (uVar6 <= uVar8) break;
    this_00 = ppFVar2[uVar8];
    pPVar4 = PcodeOpBank::findOp(o,&this_00->op->start);
    iVar3 = FuncCallSpecs::clone(this_00,(__fn *)pPVar4,__child_stack,(int)uVar6,in_R8);
    partialflow.glb = (Architecture *)CONCAT44(extraout_var,iVar3);
    vn = *(pPVar4->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
          super__Vector_impl_data._M_start;
    if (((vn->loc).base)->type == IPTR_FSPEC) {
      vn_00 = newVarnodeCallSpecs(this,(FuncCallSpecs *)partialflow.glb);
      opSetInput(this,pPVar4,vn_00,0);
      VarnodeBank::destroy(local_1d0,vn);
    }
    std::vector<FuncCallSpecs_*,_std::allocator<FuncCallSpecs_*>_>::push_back
              (local_1c8,(value_type *)&partialflow);
    uVar8 = uVar8 + 1;
  }
  ppJVar9 = (fd->jumpvec).super__Vector_base<JumpTable_*,_std::allocator<JumpTable_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_1d0 = (VarnodeBank *)&this->jumpvec;
  do {
    if (ppJVar9 ==
        (fd->jumpvec).super__Vector_base<JumpTable_*,_std::allocator<JumpTable_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      FlowInfo::FlowInfo(&partialflow,this,o,&this->bblocks,local_1c8,local_1c0);
      if (partialflow.injectlist.super__Vector_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>._M_impl.
          super__Vector_impl_data._M_start !=
          partialflow.injectlist.super__Vector_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        FlowInfo::injectPcode(&partialflow);
      }
      partialflow.flags = partialflow.flags & 0x1000;
      FlowInfo::generateBlocks(&partialflow);
      *(byte *)&this->flags = (byte)this->flags | 2;
      FlowInfo::~FlowInfo(&partialflow);
      return;
    }
    if ((*ppJVar9)->indirect != (PcodeOp *)0x0) {
      pPVar4 = PcodeOpBank::findOp(o,&(*ppJVar9)->indirect->start);
      if (pPVar4 == (PcodeOp *)0x0) {
        pLVar5 = (LowlevelError *)__cxa_allocate_exception(0x20);
        std::__cxx11::string::string
                  ((string *)&partialflow,"Could not trace jumptable across partial clone",
                   &local_1d1);
        LowlevelError::LowlevelError(pLVar5,(string *)&partialflow);
        __cxa_throw(pLVar5,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
      }
      this_01 = (Architecture *)operator_new(0xb0);
      JumpTable::JumpTable((JumpTable *)this_01,*ppJVar9);
      (this_01->super_AddrSpaceManager).shortcut2Space._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_parent = (_Base_ptr)(pPVar4->start).pc.base;
      (this_01->super_AddrSpaceManager).shortcut2Space._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_left = (_Base_ptr)(pPVar4->start).pc.offset;
      (this_01->super_AddrSpaceManager).shortcut2Space._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_right = (_Base_ptr)pPVar4;
      partialflow.glb = this_01;
      std::vector<JumpTable_*,_std::allocator<JumpTable_*>_>::push_back
                ((vector<JumpTable_*,_std::allocator<JumpTable_*>_> *)local_1d0,
                 (value_type *)&partialflow);
    }
    ppJVar9 = ppJVar9 + 1;
  } while( true );
}

Assistant:

void Funcdata::truncatedFlow(const Funcdata *fd,const FlowInfo *flow)

{
  if (!obank.empty())
    throw LowlevelError("Trying to do truncated flow on pre-existing pcode");

  list<PcodeOp *>::const_iterator oiter; // Clone the raw pcode
  for(oiter=fd->obank.beginDead();oiter!=fd->obank.endDead();++oiter)
    cloneOp(*oiter,(*oiter)->getSeqNum());
  obank.setUniqId(fd->obank.getUniqId());

  // Clone callspecs
  for(int4 i=0;i<fd->qlst.size();++i) {
    FuncCallSpecs *oldspec = fd->qlst[i];
    PcodeOp *newop = findOp(oldspec->getOp()->getSeqNum());
    FuncCallSpecs *newspec = oldspec->clone(newop);
    Varnode *invn0 = newop->getIn(0);
    if (invn0->getSpace()->getType() == IPTR_FSPEC) { // Replace embedded pointer to callspec
      Varnode *newvn0 = newVarnodeCallSpecs(newspec);
      opSetInput(newop,newvn0,0);
      deleteVarnode(invn0);
    }
    qlst.push_back(newspec);
  }

  vector<JumpTable *>::const_iterator jiter; // Clone the jumptables
  for(jiter=fd->jumpvec.begin();jiter!=fd->jumpvec.end();++jiter) {
    PcodeOp *indop = (*jiter)->getIndirectOp();
    if (indop == (PcodeOp *)0)	// If indirect op has not been linked, this is probably a jumptable override
      continue;			// that has not been reached by the flow yet, so we ignore/truncate it
    PcodeOp *newop = findOp(indop->getSeqNum());
    if (newop == (PcodeOp *)0)
      throw LowlevelError("Could not trace jumptable across partial clone");
    JumpTable *jtclone = new JumpTable(*jiter);
    jtclone->setIndirectOp(newop);
    jumpvec.push_back(jtclone);
  }

  FlowInfo partialflow(*this,obank,bblocks,qlst,flow); // Clone the flow
  if (partialflow.hasInject())
    partialflow.injectPcode();
  // Clear error reporting flags
  // Keep possible unreachable flag
  partialflow.clearFlags(~((uint4)FlowInfo::possible_unreachable));

  partialflow.generateBlocks(); // Generate basic blocks for partial flow
  flags |= blocks_generated;
}